

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inproc_shutdown.c
# Opt level: O2

int main(void)

{
  FILE *pFVar1;
  int line;
  int iVar2;
  uint *puVar3;
  char *pcVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar5;
  undefined8 extraout_RDX_01;
  long lVar6;
  nn_thread threads [100];
  
  line = nn_socket(1,0x20);
  pFVar1 = _stderr;
  if (line == -1) {
    puVar3 = (uint *)__errno_location();
    pcVar4 = nn_err_strerror(*puVar3);
    fprintf(pFVar1,"Failed create socket: %s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar3,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc_shutdown.c"
            ,0x3a);
    nn_err_abort();
  }
  iVar2 = nn_bind(line,"inproc://test");
  pFVar1 = _stderr;
  if (-1 < iVar2) {
    uVar5 = extraout_RDX;
    for (iVar2 = 0; iVar2 != 10; iVar2 = iVar2 + 1) {
      for (lVar6 = 0; lVar6 != 0x960; lVar6 = lVar6 + 0x18) {
        nn_thread_init((nn_thread *)((long)&threads[0].routine + lVar6),routine,(void *)0x0);
        uVar5 = extraout_RDX_00;
      }
      for (lVar6 = 0; lVar6 != 0x960; lVar6 = lVar6 + 0x18) {
        nn_thread_term((nn_thread *)((long)&threads[0].routine + lVar6));
        uVar5 = extraout_RDX_01;
      }
    }
    test_close_impl((char *)0x44,line,(int)uVar5);
    return 0;
  }
  puVar3 = (uint *)__errno_location();
  pcVar4 = nn_err_strerror(*puVar3);
  fprintf(pFVar1,"Failed bind to \"%s\": %s [%d] (%s:%d)\n","inproc://test",pcVar4,(ulong)*puVar3,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc_shutdown.c"
          ,0x3b);
  nn_err_abort();
}

Assistant:

int main ()
{
    int sb;
    int i;
    int j;
    struct nn_thread threads [THREAD_COUNT];

    /*  Stress the shutdown algorithm. */

    sb = test_socket (AF_SP, NN_PUB);
    test_bind (sb, SOCKET_ADDRESS);

    for (j = 0; j != 10; ++j) {
        for (i = 0; i != THREAD_COUNT; ++i)
            nn_thread_init (&threads [i], routine, NULL);
        for (i = 0; i != THREAD_COUNT; ++i)
            nn_thread_term (&threads [i]);
    }

    test_close (sb);

    return 0;
}